

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_setreleasehook(HSQUIRRELVM v,SQInteger idx,SQRELEASEHOOK hook)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  _HashNode *in_RDX;
  SQObjectPtr *ud;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  
  pSVar2 = stack_get(in_stack_ffffffffffffffe0,
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    ((pSVar2->super_SQObject)._unVal.pClass)->_hook = (SQRELEASEHOOK)in_RDX;
  }
  else if (SVar1 == OT_USERDATA) {
    ((pSVar2->super_SQObject)._unVal.pTable)->_nodes = in_RDX;
  }
  else if (SVar1 == OT_INSTANCE) {
    ((pSVar2->super_SQObject)._unVal.pTable)->_numofnodes = (SQInteger)in_RDX;
  }
  return;
}

Assistant:

void sq_setreleasehook(HSQUIRRELVM v,SQInteger idx,SQRELEASEHOOK hook)
{
    SQObjectPtr &ud=stack_get(v,idx);
    switch(sq_type(ud) ) {
    case OT_USERDATA:   _userdata(ud)->_hook = hook;    break;
    case OT_INSTANCE:   _instance(ud)->_hook = hook;    break;
    case OT_CLASS:      _class(ud)->_hook = hook;       break;
    default: return;
    }
}